

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageCrop(Image *image,Rectangle crop)

{
  Image *pIVar1;
  int iVar2;
  void *pvVar3;
  int local_38;
  int local_34;
  int offsetSize;
  int y;
  uchar *croppedData;
  int bytesPerPixel;
  Image *image_local;
  Rectangle crop_local;
  
  crop_local._0_8_ = crop._8_8_;
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    image_local._0_4_ = crop.x;
    pIVar1 = crop._0_8_;
    if (image_local._0_4_ < 0.0) {
      crop_local.x = crop.width;
      crop_local.y = crop.height;
      crop_local.x = image_local._0_4_ + crop_local.x;
      image_local = (Image *)((ulong)crop._0_8_ & 0xffffffff00000000);
      pIVar1 = image_local;
    }
    image_local = pIVar1;
    if (image_local._4_4_ < 0.0) {
      crop_local.y = image_local._4_4_ + crop_local.y;
      image_local = (Image *)((ulong)image_local & 0xffffffff);
    }
    if ((float)image->width < image_local._0_4_ + crop_local.x) {
      crop_local.x = (float)image->width - image_local._0_4_;
    }
    if ((float)image->height < image_local._4_4_ + crop_local.y) {
      crop_local.y = (float)image->height - image_local._4_4_;
    }
    if (((float)image->width < image_local._0_4_) || ((float)image->height < image_local._4_4_)) {
      TraceLog(4,"IMAGE: Failed to crop, rectangle out of bounds");
    }
    else {
      if (1 < image->mipmaps) {
        TraceLog(4,"Image manipulation only applied to base mipmap level");
      }
      if (image->format < 0xb) {
        iVar2 = GetPixelDataSize(1,1,image->format);
        pvVar3 = malloc((long)((int)(crop_local.x * crop_local.y) * iVar2));
        local_38 = 0;
        for (local_34 = (int)image_local._4_4_; local_34 < (int)(image_local._4_4_ + crop_local.y);
            local_34 = local_34 + 1) {
          memcpy((void *)((long)pvVar3 + (long)local_38),
                 (void *)((long)image->data +
                         (long)((local_34 * image->width + (int)image_local._0_4_) * iVar2)),
                 (long)((int)crop_local.x * iVar2));
          local_38 = (int)crop_local.x * iVar2 + local_38;
        }
        free(image->data);
        image->data = pvVar3;
        image->width = (int)crop_local.x;
        image->height = (int)crop_local.y;
      }
      else {
        TraceLog(4,"Image manipulation not supported for compressed formats");
      }
    }
  }
  return;
}

Assistant:

void ImageCrop(Image *image, Rectangle crop)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    // Security checks to validate crop rectangle
    if (crop.x < 0) { crop.width += crop.x; crop.x = 0; }
    if (crop.y < 0) { crop.height += crop.y; crop.y = 0; }
    if ((crop.x + crop.width) > image->width) crop.width = image->width - crop.x;
    if ((crop.y + crop.height) > image->height) crop.height = image->height - crop.y;
    if ((crop.x > image->width) || (crop.y > image->height))
    {
        TRACELOG(LOG_WARNING, "IMAGE: Failed to crop, rectangle out of bounds");
        return;
    }

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);

        unsigned char *croppedData = (unsigned char *)RL_MALLOC((int)(crop.width*crop.height)*bytesPerPixel);

        // OPTION 1: Move cropped data line-by-line
        for (int y = (int)crop.y, offsetSize = 0; y < (int)(crop.y + crop.height); y++)
        {
            memcpy(croppedData + offsetSize, ((unsigned char *)image->data) + (y*image->width + (int)crop.x)*bytesPerPixel, (int)crop.width*bytesPerPixel);
            offsetSize += ((int)crop.width*bytesPerPixel);
        }

        /*
        // OPTION 2: Move cropped data pixel-by-pixel or byte-by-byte
        for (int y = (int)crop.y; y < (int)(crop.y + crop.height); y++)
        {
            for (int x = (int)crop.x; x < (int)(crop.x + crop.width); x++)
            {
                //memcpy(croppedData + ((y - (int)crop.y)*(int)crop.width + (x - (int)crop.x))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + x)*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) croppedData[((y - (int)crop.y)*(int)crop.width + (x - (int)crop.x))*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + x)*bytesPerPixel + i];
            }
        }
        */

        RL_FREE(image->data);
        image->data = croppedData;
        image->width = (int)crop.width;
        image->height = (int)crop.height;
    }
}